

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

void __thiscall
LowererMDArch::GeneratePreCall
          (LowererMDArch *this,Instr *callInstr,Opnd *functionObjOpnd,
          Instr *insertBeforeInstrForCFGCheck)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  byte bVar4;
  DWORD offset;
  uint32 offset_00;
  RegOpnd *baseOpnd;
  undefined4 *puVar5;
  IndirOpnd *pIVar6;
  Instr *pIVar7;
  Opnd *dstOpnd;
  Func *pFVar8;
  IRType type;
  
  if (insertBeforeInstrForCFGCheck == (Instr *)0x0) {
    insertBeforeInstrForCFGCheck = callInstr;
  }
  if (callInstr->m_opcode == AsmJsCallI) {
    baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
    OVar2 = IR::Opnd::GetKind(functionObjOpnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_00643b82;
      *puVar5 = 0;
    }
    pIVar6 = IR::IndirOpnd::New((RegOpnd *)functionObjOpnd,8,TyInt64,this->m_func,false);
    pIVar7 = IR::Instr::New(MOV,&baseOpnd->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar7);
    pIVar6 = IR::IndirOpnd::New(baseOpnd,0x38,TyInt64,this->m_func,false);
    pIVar7 = IR::Instr::New(MOV,&baseOpnd->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar7);
    pFVar8 = this->m_func;
    offset_00 = 0x10;
    type = TyInt64;
  }
  else {
    OVar2 = IR::Opnd::GetKind(functionObjOpnd);
    if (OVar2 == OpndKindAddr) {
      OVar2 = IR::Opnd::GetKind(functionObjOpnd);
      if (OVar2 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar3) goto LAB_00643b82;
        *puVar5 = 0;
      }
      if (((ushort)functionObjOpnd[2].m_valueType.field_0 & 2) == 0) goto LAB_00643833;
      baseOpnd = Lowerer::GenerateFunctionTypeFromFixedFunctionObject
                           (this->lowererMD->m_lowerer,insertBeforeInstrForCFGCheck,functionObjOpnd)
      ;
    }
    else {
LAB_00643833:
      OVar2 = IR::Opnd::GetKind(functionObjOpnd);
      if (OVar2 == OpndKindReg) {
        OVar2 = IR::Opnd::GetKind(functionObjOpnd);
        if (OVar2 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_00643b82;
          *puVar5 = 0;
        }
        if (*(char *)((long)functionObjOpnd[1]._vptr_Opnd + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0x2c2,"(functionObjOpnd->AsRegOpnd()->m_sym->IsStackSym())",
                             "Expected call target to be a stack symbol.");
          if (!bVar3) goto LAB_00643b82;
          *puVar5 = 0;
        }
        baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
        OVar2 = IR::Opnd::GetKind(functionObjOpnd);
        if (OVar2 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_00643b82;
          *puVar5 = 0;
        }
        offset = Js::DynamicObject::GetOffsetOfType();
        pIVar6 = IR::IndirOpnd::New((RegOpnd *)functionObjOpnd,offset,TyInt64,this->m_func,false);
        pIVar7 = IR::Instr::New(MOV,&baseOpnd->super_Opnd,&pIVar6->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar7);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x2cf,"(false)","Unexpected call target operand type.");
        if (!bVar3) goto LAB_00643b82;
        *puVar5 = 0;
        baseOpnd = (RegOpnd *)0x0;
      }
    }
    offset_00 = Js::Type::GetOffsetOfEntryPoint();
    pFVar8 = this->m_func;
    type = TyUint64;
  }
  pIVar6 = IR::IndirOpnd::New(baseOpnd,offset_00,type,pFVar8,false);
  baseOpnd->field_0x18 = baseOpnd->field_0x18 | 2;
  pIVar7 = IR::Instr::New(MOV,&baseOpnd->super_Opnd,&pIVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar7);
  if (callInstr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00643b82;
    *puVar5 = 0;
  }
  pFVar8 = callInstr->m_func;
  if ((baseOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_00643b82:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar4 = (baseOpnd->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    baseOpnd = (RegOpnd *)IR::Opnd::Copy(&baseOpnd->super_Opnd,pFVar8);
    bVar4 = (baseOpnd->super_Opnd).field_0xb;
  }
  (baseOpnd->super_Opnd).field_0xb = bVar4 | 2;
  callInstr->m_src1 = &baseOpnd->super_Opnd;
  dstOpnd = GetArgSlotOpnd(this,1,(StackSym *)0x0,false);
  pIVar7 = IR::Instr::New(MOV,dstOpnd,functionObjOpnd,this->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar7);
  return;
}

Assistant:

void
LowererMDArch::GeneratePreCall(IR::Instr * callInstr, IR::Opnd  *functionObjOpnd, IR::Instr * insertBeforeInstrForCFGCheck)
{
    if (insertBeforeInstrForCFGCheck == nullptr)
    {
        insertBeforeInstrForCFGCheck = callInstr;
    }

    IR::RegOpnd * functionTypeRegOpnd = nullptr;
    IR::IndirOpnd * entryPointIndirOpnd = nullptr;
    if (callInstr->m_opcode == Js::OpCode::AsmJsCallI)
    {
        functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);

        IR::IndirOpnd* functionInfoIndirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func);

        IR::Instr* instr = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionInfoIndirOpnd, m_func);

        insertBeforeInstrForCFGCheck->InsertBefore(instr);

        functionInfoIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::ScriptFunctionType::GetEntryPointInfoOffset(), TyMachReg, m_func);
        instr = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionInfoIndirOpnd, m_func);
        insertBeforeInstrForCFGCheck->InsertBefore(instr);

        uint32 entryPointOffset = Js::ProxyEntryPointInfo::GetAddressOffset();

        entryPointIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, entryPointOffset, TyMachReg, m_func);
    }
    else
    {
        // For calls to fixed functions we load the function's type directly from the known (hard-coded) function object address.
        // For other calls, we need to load it from the function object stored in a register operand.
        if (functionObjOpnd->IsAddrOpnd() && functionObjOpnd->AsAddrOpnd()->m_isFunction)
        {
            functionTypeRegOpnd = this->lowererMD->m_lowerer->GenerateFunctionTypeFromFixedFunctionObject(insertBeforeInstrForCFGCheck, functionObjOpnd);
        }
        else if (functionObjOpnd->IsRegOpnd())
        {
            AssertMsg(functionObjOpnd->AsRegOpnd()->m_sym->IsStackSym(), "Expected call target to be a stack symbol.");

            functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);
            // functionTypeRegOpnd(RAX) = MOV function->type
            {
                IR::IndirOpnd * functionTypeIndirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(),
                    Js::DynamicObject::GetOffsetOfType(), TyMachReg, m_func);
                IR::Instr * mov = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionTypeIndirOpnd, m_func);
                insertBeforeInstrForCFGCheck->InsertBefore(mov);
            }
        }
        else
        {
            AnalysisAssertMsg(false, "Unexpected call target operand type.");
        }
        // entryPointRegOpnd(RAX) = MOV type->entryPoint
        entryPointIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::Type::GetOffsetOfEntryPoint(), TyMachPtr, m_func);
    }

    IR::RegOpnd *entryPointRegOpnd = functionTypeRegOpnd;
    entryPointRegOpnd->m_isCallArg = true;

    IR::Instr *mov = IR::Instr::New(Js::OpCode::MOV, entryPointRegOpnd, entryPointIndirOpnd, m_func);
    insertBeforeInstrForCFGCheck->InsertBefore(mov);

    // entryPointRegOpnd(RAX) = CALL entryPointRegOpnd(RAX)
    callInstr->SetSrc1(entryPointRegOpnd);

#if defined(_CONTROL_FLOW_GUARD)
    // verify that the call target is valid (CFG Check)
    if (!PHASE_OFF(Js::CFGInJitPhase, this->m_func))
    {
        this->lowererMD->GenerateCFGCheck(entryPointRegOpnd, insertBeforeInstrForCFGCheck);
    }
#endif

    // Setup the first call argument - pointer to the function being called.
    IR::Instr * instrMovArg1 = IR::Instr::New(Js::OpCode::MOV, GetArgSlotOpnd(1), functionObjOpnd, m_func);
    callInstr->InsertBefore(instrMovArg1);
}